

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_statistics.cpp
# Opt level: O3

bool duckdb::HasFilterConstants(TableFilter *duckdb_filter)

{
  TableFilterType TVar1;
  pointer puVar2;
  bool bVar3;
  ConstantFilter *pCVar4;
  ConjunctionOrFilter *pCVar5;
  type pTVar6;
  ConjunctionAndFilter *pCVar7;
  byte bVar8;
  unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> *child_filter;
  pointer puVar9;
  
  TVar1 = duckdb_filter->filter_type;
  if (TVar1 == CONJUNCTION_AND) {
    pCVar7 = TableFilter::Cast<duckdb::ConjunctionAndFilter>(duckdb_filter);
    puVar9 = (pCVar7->super_ConjunctionFilter).child_filters.
             super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar2 = (pCVar7->super_ConjunctionFilter).child_filters.
             super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar9 != puVar2) {
      bVar8 = 0;
      do {
        pTVar6 = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::
                 operator*(puVar9);
        bVar3 = HasFilterConstants(pTVar6);
        bVar8 = bVar8 | bVar3;
        puVar9 = puVar9 + 1;
      } while (puVar9 != puVar2);
      goto LAB_01085d85;
    }
  }
  else if (TVar1 == CONJUNCTION_OR) {
    pCVar5 = TableFilter::Cast<duckdb::ConjunctionOrFilter>(duckdb_filter);
    puVar9 = (pCVar5->super_ConjunctionFilter).child_filters.
             super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar2 = (pCVar5->super_ConjunctionFilter).child_filters.
             super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar9 != puVar2) {
      bVar8 = 0;
      do {
        pTVar6 = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::
                 operator*(puVar9);
        bVar3 = HasFilterConstants(pTVar6);
        bVar8 = bVar8 | bVar3;
        puVar9 = puVar9 + 1;
      } while (puVar9 != puVar2);
      goto LAB_01085d85;
    }
  }
  else if ((TVar1 == CONSTANT_COMPARISON) &&
          (pCVar4 = TableFilter::Cast<duckdb::ConstantFilter>(duckdb_filter),
          (pCVar4->super_TableFilter).field_0x9 == '\x19')) {
    bVar8 = (pCVar4->constant).is_null ^ 1;
    goto LAB_01085d85;
  }
  bVar8 = 0;
LAB_01085d85:
  return (bool)(bVar8 & 1);
}

Assistant:

static bool HasFilterConstants(const TableFilter &duckdb_filter) {
	switch (duckdb_filter.filter_type) {
	case TableFilterType::CONSTANT_COMPARISON: {
		auto &constant_filter = duckdb_filter.Cast<ConstantFilter>();
		return (constant_filter.comparison_type == ExpressionType::COMPARE_EQUAL && !constant_filter.constant.IsNull());
	}
	case TableFilterType::CONJUNCTION_AND: {
		auto &conjunction_and_filter = duckdb_filter.Cast<ConjunctionAndFilter>();
		bool child_has_constant = false;
		for (auto &child_filter : conjunction_and_filter.child_filters) {
			child_has_constant |= HasFilterConstants(*child_filter);
		}
		return child_has_constant;
	}
	case TableFilterType::CONJUNCTION_OR: {
		auto &conjunction_or_filter = duckdb_filter.Cast<ConjunctionOrFilter>();
		bool child_has_constant = false;
		for (auto &child_filter : conjunction_or_filter.child_filters) {
			child_has_constant |= HasFilterConstants(*child_filter);
		}
		return child_has_constant;
	}
	default:
		return false;
	}
}